

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label.c
# Opt level: O2

int blob_write_plot(blob_t *blobs,int count,char *filename)

{
  FILE *__stream;
  FILE *__stream_00;
  int *piVar1;
  char *pcVar2;
  int iVar3;
  ulong uVar4;
  blob_t *pbVar5;
  long lVar6;
  ulong uVar7;
  int j;
  long lVar8;
  
  __stream_00 = fopen(filename,"wb");
  __stream = _stderr;
  if (__stream_00 == (FILE *)0x0) {
    piVar1 = __errno_location();
    pcVar2 = strerror(*piVar1);
    iVar3 = 0;
    fprintf(__stream,"failed to open %s : %s\n",filename,pcVar2);
  }
  else {
    uVar7 = 0;
    uVar4 = (ulong)(uint)count;
    if (count < 1) {
      uVar4 = uVar7;
    }
    for (; uVar7 != uVar4; uVar7 = uVar7 + 1) {
      pbVar5 = blobs + uVar7;
      contour_write_plot(&pbVar5->external,(short)*(undefined4 *)pbVar5 * 2,(FILE *)__stream_00);
      fputc(10,__stream_00);
      if (pbVar5->internal != (contour_t *)0x0) {
        pbVar5 = blobs + uVar7;
        lVar6 = 0;
        for (lVar8 = 0; lVar8 < pbVar5->internal_count; lVar8 = lVar8 + 1) {
          contour_write_plot((contour_t *)((long)&pbVar5->internal->count + lVar6),
                             (short)*(undefined4 *)pbVar5 * 2 + 1,(FILE *)__stream_00);
          fputc(10,__stream_00);
          lVar6 = lVar6 + 0x10;
        }
      }
    }
    fclose(__stream_00);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int blob_write_plot(blob_t *blobs, int count, const char *filename)
{
    int i;
    FILE *out = fopen(filename, "wb");
    if(NULL == out)
    {
        fprintf(stderr, "failed to open %s : %s\n", filename, strerror(errno));
        return 0;
    }

    for(i=0; i<count; i++)
    {
        contour_write_plot(&blobs[i].external, 2 * blobs[i].label, out);
        fprintf(out, "\n");
        if(NULL != blobs[i].internal)
        {
            int j;
            for(j=0; j<blobs[i].internal_count; j++)
            {
                contour_write_plot(blobs[i].internal + j,  (2 * blobs[i].label) + 1, out);
                fprintf(out, "\n");
            }
        }
    }
    fclose(out);
    return 1;
}